

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark3.cpp
# Opt level: O2

void __thiscall Codecc::Codecc(Codecc *this,size_t maxPacketSize)

{
  __shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  this->w = 0;
  this->r = 0;
  (this->buffer).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buffer).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->maxPacketSize = maxPacketSize;
  hwnet::Buffer::New((Buffer *)&local_28,maxPacketSize * 2,maxPacketSize * 2);
  std::__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> *)this,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

Codecc(size_t maxPacketSize):w(0),r(0),maxPacketSize(maxPacketSize) {
		this->buffer = Buffer::New(maxPacketSize*2,maxPacketSize*2);
	}